

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O2

int per_put_few_bits(asn_per_outp_t *po,uint32_t bits,int obits)

{
  uint8_t *puVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int unaff_R13D;
  size_t sVar12;
  
  uVar10 = (ulong)(uint)obits;
  puVar1 = po->tmpspace;
  bVar3 = false;
  do {
    iVar8 = (int)uVar10;
    if (iVar8 - 0x20U < 0xffffffe1) {
      iVar8 = -(uint)(iVar8 != 0);
LAB_0014ab06:
      if (bVar3) {
        iVar8 = unaff_R13D;
      }
      return iVar8;
    }
    uVar9 = po->nboff;
    if (uVar9 < 8) {
      puVar7 = po->buffer;
      uVar6 = po->nbits;
    }
    else {
      puVar7 = po->buffer + (uVar9 >> 3);
      po->buffer = puVar7;
      uVar6 = po->nbits - (uVar9 & 0xfffffffffffffff8);
      po->nbits = uVar6;
      uVar9 = (ulong)((uint)uVar9 & 7);
      po->nboff = uVar9;
    }
    uVar11 = uVar9 + uVar10;
    if (uVar6 < uVar11) {
      sVar12 = (size_t)((int)puVar7 - (int)puVar1);
      iVar5 = (*po->outper)(puVar1,sVar12,po->op_key);
      if (iVar5 < 0) {
        iVar8 = -1;
        goto LAB_0014ab06;
      }
      uVar9 = po->nboff;
      if (uVar9 != 0) {
        po->tmpspace[0] = *po->buffer;
      }
      po->buffer = puVar1;
      po->nbits = 0x100;
      po->flushed_bytes = po->flushed_bytes + sVar12;
      uVar11 = uVar10 + uVar9;
      puVar7 = puVar1;
    }
    bits = bits & ~(-1 << ((byte)uVar10 & 0x1f));
    cVar4 = (char)uVar11;
    bVar2 = (byte)(-1 << (8U - (char)uVar9 & 0x1f));
    if (uVar11 < 9) {
      po->nboff = uVar11;
      *puVar7 = bVar2 & *puVar7 | (byte)(bits << (8U - cVar4 & 0x1f));
LAB_0014ab04:
      iVar8 = 0;
      goto LAB_0014ab06;
    }
    if (uVar11 < 0x11) {
      po->nboff = uVar11;
      iVar8 = bits << (0x10U - cVar4 & 0x1f);
      *puVar7 = (byte)((uint)iVar8 >> 8) | bVar2 & *puVar7;
      puVar7[1] = (byte)iVar8;
      goto LAB_0014ab04;
    }
    if (uVar11 < 0x19) {
      po->nboff = uVar11;
      iVar8 = bits << (0x18U - cVar4 & 0x1f);
      *puVar7 = (byte)((uint)iVar8 >> 0x10) | bVar2 & *puVar7;
      puVar7[1] = (byte)((uint)iVar8 >> 8);
      puVar7[2] = (byte)iVar8;
      goto LAB_0014ab04;
    }
    if (uVar11 < 0x20) {
      po->nboff = uVar11;
      iVar8 = bits << (-cVar4 & 0x1fU);
      *puVar7 = (byte)((uint)iVar8 >> 0x18) | bVar2 & *puVar7;
      puVar7[1] = (byte)((uint)iVar8 >> 0x10);
      puVar7[2] = (byte)((uint)iVar8 >> 8);
      puVar7[3] = (byte)iVar8;
      goto LAB_0014ab04;
    }
    uVar10 = (ulong)(iVar8 - 0x18U);
    per_put_few_bits(po,bits >> ((byte)(iVar8 - 0x18U) & 0x1f),0x18);
    if (!bVar3) {
      unaff_R13D = 0;
    }
    bVar3 = true;
  } while( true );
}

Assistant:

int
per_put_few_bits(asn_per_outp_t *po, uint32_t bits, int obits) {
	size_t off;	/* Next after last bit offset */
	size_t omsk;	/* Existing last byte meaningful bits mask */
	uint8_t *buf;

	if(obits <= 0 || obits >= 32) return obits ? -1 : 0;

	ASN_DEBUG("[PER put %d bits %x to %p+%d bits]",
			obits, (int)bits, po->buffer, (int)po->nboff);

	/*
	 * Normalize position indicator.
	 */
	if(po->nboff >= 8) {
		po->buffer += (po->nboff >> 3);
		po->nbits  -= (po->nboff & ~0x07);
		po->nboff  &= 0x07;
	}

	/*
	 * Flush whole-bytes output, if necessary.
	 */
	if(po->nboff + obits > po->nbits) {
		int complete_bytes = (po->buffer - po->tmpspace);
		ASN_DEBUG("[PER output %ld complete + %ld]",
			(long)complete_bytes, (long)po->flushed_bytes);
		if(po->outper(po->tmpspace, complete_bytes, po->op_key) < 0)
			return -1;
		if(po->nboff)
			po->tmpspace[0] = po->buffer[0];
		po->buffer = po->tmpspace;
		po->nbits = 8 * sizeof(po->tmpspace);
		po->flushed_bytes += complete_bytes;
	}

	/*
	 * Now, due to sizeof(tmpspace), we are guaranteed large enough space.
	 */
	buf = po->buffer;
	omsk = ~((1 << (8 - po->nboff)) - 1);
	off = (po->nboff + obits);

	/* Clear data of debris before meaningful bits */
	bits &= (((uint32_t)1 << obits) - 1);

	ASN_DEBUG("[PER out %d %u/%x (t=%d,o=%d) %x&%x=%x]", obits,
		(int)bits, (int)bits,
		(int)po->nboff, (int)off,
		buf[0], (int)(omsk&0xff),
		(int)(buf[0] & omsk));

	if(off <= 8)	/* Completely within 1 byte */
		po->nboff = off,
		bits <<= (8 - off),
		buf[0] = (buf[0] & omsk) | bits;
	else if(off <= 16)
		po->nboff = off,
		bits <<= (16 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 8),
		buf[1] = bits;
	else if(off <= 24)
		po->nboff = off,
		bits <<= (24 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 16),
		buf[1] = bits >> 8,
		buf[2] = bits;
	else if(off <= 31)
		po->nboff = off,
		bits <<= (32 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 24),
		buf[1] = bits >> 16,
		buf[2] = bits >> 8,
		buf[3] = bits;
	else {
		per_put_few_bits(po, bits >> (obits - 24), 24);
		per_put_few_bits(po, bits, obits - 24);
	}

	ASN_DEBUG("[PER out %u/%x => %02x buf+%ld]",
		(int)bits, (int)bits, buf[0],
		(long)(po->buffer - po->tmpspace));

	return 0;
}